

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b-ref.c
# Opt level: O2

int blake2b_init_param(blake2b_state *S,blake2b_param *P)

{
  long lVar1;
  
  memset(S,0,0x180);
  for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 8) {
    *(undefined8 *)((long)S->h + lVar1) = *(undefined8 *)((long)blake2b_IV + lVar1);
  }
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    S->h[lVar1] = S->h[lVar1] ^ *(ulong *)(P->reserved + lVar1 * 8 + -0x12);
  }
  return 0;
}

Assistant:

int blake2b_init_param( blake2b_state *S, const blake2b_param *P )
{
    size_t i;
    uint8_t *p;

  blake2b_init0( S );
    p = ( uint8_t * )( P );

  /* IV XOR ParamBlock */
  for( i = 0; i < 8; ++i )
    S->h[i] ^= load64( p + sizeof( S->h[i] ) * i );

  return 0;
}